

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall Printer::printBoard(Printer *this,Board *board,Player *player1)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  Cell *pCVar6;
  Player *pPVar7;
  Printer *pPVar8;
  int j;
  int iVar9;
  int iVar10;
  uint col;
  int i;
  uint row;
  ulong uVar11;
  bool bVar12;
  uint local_90;
  int local_7c;
  Cell c;
  string LTTRS;
  
  std::__cxx11::string::string((string *)&LTTRS,"ABCDEFGHJKLMNOPQRSTUVWXYZ",(allocator *)&c);
  uVar1 = board->size;
  iVar2 = (int)uVar1 / 10;
  local_7c = -2;
  if (-2 < iVar2) {
    local_7c = iVar2;
  }
  local_7c = local_7c + 2;
  iVar9 = local_7c;
  while (bVar12 = iVar9 != 0, iVar9 = iVar9 + -1, bVar12) {
    std::operator<<((ostream *)&std::cout," ");
  }
  uVar11 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != uVar11; uVar11 = uVar11 + 1) {
    pcVar4 = (char *)std::__cxx11::string::at((ulong)&LTTRS);
    poVar5 = std::operator<<((ostream *)&std::cout,*pcVar4);
    std::operator<<(poVar5," ");
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  iVar9 = -1;
  if (-1 < iVar2) {
    iVar9 = iVar2;
  }
  iVar9 = iVar9 + 1;
  iVar10 = iVar9;
  while (bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12) {
    std::operator<<((ostream *)&std::cout," ");
  }
  std::operator<<((ostream *)&std::cout,"+");
  uVar11 = uVar3;
  while (iVar10 = (int)uVar11, uVar11 = (ulong)(iVar10 - 1), iVar10 != 0) {
    std::operator<<((ostream *)&std::cout,"--");
  }
  std::operator<<((ostream *)&std::cout,"+");
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  row = 0;
  while( true ) {
    iVar10 = iVar2 - row / 10;
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    local_90 = (uint)uVar3;
    if (row == local_90) break;
    while (bVar12 = iVar10 != 0, iVar10 = iVar10 + -1, bVar12) {
      std::operator<<((ostream *)&std::cout," ");
    }
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,row);
    std::operator<<(poVar5,"|");
    for (col = 0; uVar1 != col; col = col + 1) {
      pCVar6 = Board::getCell(board,row,col);
      c.playerOwned = pCVar6->playerOwned;
      c.row_coordinate = pCVar6->row_coordinate;
      c.column_coordinate = pCVar6->column_coordinate;
      c.occupied = pCVar6->occupied;
      c._9_7_ = *(undefined7 *)&pCVar6->field_0x9;
      bVar12 = Cell::isOccupied(&c);
      pPVar8 = this;
      if (bVar12) {
        pPVar7 = Cell::getPlayerOwned(&c);
        pPVar8 = (Printer *)((long)this + (2 - (ulong)(pPVar7 == player1)));
      }
      std::operator<<((ostream *)&std::cout,pPVar8->emptyCellIcon);
      std::operator<<((ostream *)&std::cout," ");
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"|");
    std::ostream::operator<<(poVar5,row);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    row = row + 1;
  }
  while (bVar12 = iVar9 != 0, iVar9 = iVar9 + -1, bVar12) {
    std::operator<<((ostream *)&std::cout," ");
  }
  std::operator<<((ostream *)&std::cout,"+");
  uVar11 = uVar3;
  while (iVar2 = (int)uVar11, uVar11 = (ulong)(iVar2 - 1), iVar2 != 0) {
    std::operator<<((ostream *)&std::cout,"--");
  }
  std::operator<<((ostream *)&std::cout,"+");
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  while (bVar12 = local_7c != 0, local_7c = local_7c + -1, bVar12) {
    std::operator<<((ostream *)&std::cout," ");
  }
  for (uVar11 = 0; uVar3 != uVar11; uVar11 = uVar11 + 1) {
    pcVar4 = (char *)std::__cxx11::string::at((ulong)&LTTRS);
    poVar5 = std::operator<<((ostream *)&std::cout,*pcVar4);
    std::operator<<(poVar5," ");
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  std::__cxx11::string::~string((string *)&LTTRS);
  return;
}

Assistant:

void Printer::printBoard(Board& board, const Player* player1){

  const string LTTRS = "ABCDEFGHJKLMNOPQRSTUVWXYZ";
  int n = board.size;

  // printing header
  for (int i=0; i<n/10+2; i++) cout << " "; // print offset created by row numbering
  for (int i=0; i<n; i++) cout << LTTRS.at(i) << " ";
  cout.put(cout.widen('\n'));
  cout.flush();
  for (int i=0; i<n/10+1; i++) cout << " ";
  cout << "+";
  for (int i=0; i<n; i++) cout <<"--";
  cout << "+";
  cout.put(cout.widen('\n'));
  cout.flush();

  // printing each row
  for (int i=0; i<n; i++){

    // printing row numbering at left side
    for (int j=0; j<n/10-i/10; j++) cout << " "; // print trailing spaces for formatting
    cout << i << "|";

    for (int j=0; j<n; j++){

        Cell c = board.getCell(i,j);
        if (!c.isOccupied()) cout << this->emptyCellIcon;
        else if (c.getPlayerOwned() == player1) cout << this ->player1Icon;
        else cout << this->player2Icon;

        cout << " ";
    }
    // printing row numbering at the right side
    cout << "|" << i;
    cout.put(cout.widen('\n'));
    cout.flush();
  }

  // printing footer
  for (int i=0; i<n/10+1; i++) cout << " ";
  cout << "+";
  for (int i=0; i<n; i++) cout <<"--";
  cout << "+";
  cout.put(cout.widen('\n'));
  cout.flush();
  for (int i=0; i<n/10+2; i++) cout << " ";
  for (int i=0; i<n; i++) cout << LTTRS.at(i) << " ";
  cout.put(cout.widen('\n'));
  cout.flush();

}